

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_record.cc
# Opt level: O0

ssl_open_record_t
bssl::dtls_open_record
          (SSL *ssl,uint8_t *out_type,DTLSRecordNumber *out_number,Span<unsigned_char> *out,
          size_t *out_consumed,uint8_t *out_alert,Span<unsigned_char> in)

{
  DTLS1_STATE *pDVar1;
  uint8_t type;
  bool bVar2;
  bool bVar3;
  uint16_t uVar4;
  ssl_open_record_t sVar5;
  size_t sVar6;
  DTLSReplayBitmap *pDVar7;
  uint64_t uVar8;
  pointer pSVar9;
  size_t sVar10;
  uchar *puVar11;
  pointer pDVar12;
  pointer ctx;
  pointer pDVar13;
  type pDVar14;
  CBS cbs_00;
  Span<const_unsigned_char> SVar15;
  Span<unsigned_char> in_00;
  OPENSSL_timeval OVar16;
  Span<const_unsigned_char> in_01;
  undefined1 auStack_140 [7];
  bool app_data_allowed;
  uint64_t local_120;
  uint32_t local_118;
  int local_10c;
  unique_ptr<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter> local_108;
  UniquePtr<bssl::DTLSPrevReadEpoch> prev;
  size_t local_f8;
  size_t plaintext_limit;
  bool has_padding;
  uchar *local_a0;
  undefined1 local_98 [8];
  ParsedDTLSRecord record;
  undefined1 local_50 [8];
  CBS cbs;
  uint8_t *out_alert_local;
  size_t *out_consumed_local;
  Span<unsigned_char> *out_local;
  DTLSRecordNumber *out_number_local;
  uint8_t *out_type_local;
  SSL *ssl_local;
  
  *out_consumed = 0;
  if (ssl->s3->read_shutdown == ssl_shutdown_close_notify) {
    ssl_local._4_4_ = ssl_open_record_close_notify;
  }
  else {
    cbs.len = (size_t)out_alert;
    bVar2 = Span<unsigned_char>::empty(&in);
    if (bVar2) {
      ssl_local._4_4_ = ssl_open_record_partial;
    }
    else {
      Span<unsigned_char_const>::Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
                ((Span<unsigned_char_const> *)&record.type,&in);
      cbs_st::cbs_st((cbs_st *)local_50,stack0xffffffffffffffa0);
      ParsedDTLSRecord::ParsedDTLSRecord((ParsedDTLSRecord *)local_98);
      bVar2 = parse_dtls_record(ssl,(CBS *)local_50,(ParsedDTLSRecord *)local_98);
      if (bVar2) {
        SVar15 = cbs_st::operator_cast_to_Span((cbs_st *)&record.number);
        local_a0 = (uchar *)SVar15.size_;
        in_01.size_ = (size_t)out_alert;
        in_01.data_ = local_a0;
        ssl_do_msg_callback((bssl *)ssl,(SSL *)0x0,0x100,(int)SVar15.data_,in_01);
        if (local_98 != (undefined1  [8])0x0) {
          pDVar7 = (DTLSReplayBitmap *)((long)local_98 + 0x18);
          uVar8 = DTLSRecordNumber::sequence((DTLSRecordNumber *)&record);
          bVar2 = DTLSReplayBitmap::ShouldDiscard(pDVar7,uVar8);
          if (!bVar2) {
            pSVar9 = std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator->
                               ((UniquePtr<SSLAEADContext> *)((long)local_98 + 8));
            type = (uchar)record.body.len;
            uVar8 = dtls_aead_sequence(ssl,(DTLSRecordNumber)record.read_epoch);
            SVar15 = cbs_st::operator_cast_to_Span((cbs_st *)&record.number);
            cbs_00.len = SVar15.size_;
            cbs_00.data = record.body.data;
            in_00 = cbs_to_writable_bytes((bssl *)record.header.len,cbs_00);
            bVar2 = SSLAEADContext::Open(pSVar9,out,type,record.body.len._2_2_,uVar8,SVar15,in_00);
            if (!bVar2) {
              ERR_clear_error();
              sVar6 = Span<unsigned_char>::size(&in);
              sVar10 = CBS_len((CBS *)local_50);
              *out_consumed = sVar6 - sVar10;
              return ssl_open_record_discard;
            }
            sVar6 = Span<unsigned_char>::size(&in);
            sVar10 = CBS_len((CBS *)local_50);
            *out_consumed = sVar6 - sVar10;
            pSVar9 = std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator->
                               ((UniquePtr<SSLAEADContext> *)((long)local_98 + 8));
            bVar3 = SSLAEADContext::is_null_cipher(pSVar9);
            bVar2 = false;
            if (!bVar3) {
              uVar4 = ssl_protocol_version(ssl);
              bVar2 = 0x303 < uVar4;
            }
            sVar6 = Span<unsigned_char>::size(out);
            if ((ulong)(long)(int)(bVar2 + 0x4000) < sVar6) {
              ERR_put_error(0x10,0,0x88,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/dtls_record.cc"
                            ,0x15d);
              *(undefined1 *)cbs.len = 0x16;
              return ssl_open_record_error;
            }
            if (bVar2 != false) {
              do {
                bVar2 = Span<unsigned_char>::empty(out);
                if (bVar2) {
                  ERR_put_error(0x10,0,0x8b,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/dtls_record.cc"
                                ,0x165);
                  *(undefined1 *)cbs.len = 0x33;
                  return ssl_open_record_error;
                }
                puVar11 = Span<unsigned_char>::back(out);
                record.body.len._0_1_ = *puVar11;
                sVar6 = Span<unsigned_char>::size(out);
                _prev = Span<unsigned_char>::subspan(out,0,sVar6 - 1);
                out->data_ = (uchar *)prev._M_t.
                                      super___uniq_ptr_impl<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_bssl::DTLSPrevReadEpoch_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_bssl::DTLSPrevReadEpoch_*,_false>.
                                      _M_head_impl;
                out->size_ = local_f8;
              } while ((uchar)record.body.len == '\0');
            }
            pDVar7 = (DTLSReplayBitmap *)((long)local_98 + 0x18);
            uVar8 = DTLSRecordNumber::sequence((DTLSRecordNumber *)&record);
            DTLSReplayBitmap::Record(pDVar7,uVar8);
            pDVar12 = std::unique_ptr<bssl::DTLSReadEpoch,_bssl::internal::Deleter>::get
                                (&ssl->d1->next_read_epoch);
            if (local_98 == (undefined1  [8])pDVar12) {
              uVar4 = ssl_protocol_version(ssl);
              if (uVar4 < 0x304) {
                __assert_fail("ssl_protocol_version(ssl) >= TLS1_3_VERSION",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/dtls_record.cc"
                              ,0x175,
                              "enum ssl_open_record_t bssl::dtls_open_record(SSL *, uint8_t *, DTLSRecordNumber *, Span<uint8_t> *, size_t *, uint8_t *, Span<uint8_t>)"
                             );
              }
              MakeUnique<bssl::DTLSPrevReadEpoch>();
              bVar2 = std::operator==(&local_108,(nullptr_t)0x0);
              if (bVar2) {
                *(undefined1 *)cbs.len = 0x50;
                ssl_local._4_4_ = ssl_open_record_error;
                local_10c = 1;
              }
              else {
                ctx = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&ssl->ctx);
                OVar16 = ssl_ctx_get_current_time(ctx);
                local_118 = OVar16.tv_usec;
                local_120 = OVar16.tv_sec;
                pDVar13 = std::unique_ptr<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter>::
                          operator->(&local_108);
                pDVar13->expire = OVar16.tv_sec;
                pDVar13 = std::unique_ptr<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter>::
                          operator->(&local_108);
                if (pDVar13->expire < 0xffffffffffffff0f) {
                  pDVar13 = std::unique_ptr<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter>::
                            operator->(&local_108);
                  pDVar13->expire = pDVar13->expire + 0xf0;
                }
                else {
                  pDVar13 = std::unique_ptr<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter>::
                            operator->(&local_108);
                  pDVar13->expire = 0xffffffffffffffff;
                }
                pDVar1 = ssl->d1;
                pDVar13 = std::unique_ptr<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter>::
                          operator->(&local_108);
                DTLSReadEpoch::operator=(&pDVar13->epoch,&pDVar1->read_epoch);
                std::unique_ptr<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter>::operator=
                          (&ssl->d1->prev_read_epoch,&local_108);
                pDVar14 = std::unique_ptr<bssl::DTLSReadEpoch,_bssl::internal::Deleter>::operator*
                                    (&ssl->d1->next_read_epoch);
                DTLSReadEpoch::operator=(&ssl->d1->read_epoch,pDVar14);
                std::unique_ptr<bssl::DTLSReadEpoch,_bssl::internal::Deleter>::operator=
                          (&ssl->d1->next_read_epoch,(nullptr_t)0x0);
                local_10c = 0;
              }
              std::unique_ptr<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter>::~unique_ptr
                        (&local_108);
              if (local_10c != 0) {
                return ssl_local._4_4_;
              }
            }
            sVar6 = cbs.len;
            if ((uchar)record.body.len == '\x15') {
              Span<unsigned_char_const>::
              Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
                        ((Span<unsigned_char_const> *)auStack_140,out);
              sVar5 = ssl_process_alert(ssl,(uint8_t *)sVar6,_auStack_140);
              return sVar5;
            }
            if ((uchar)record.body.len == '\x17') {
              if ((ssl->s3->version == 0) || (uVar4 = ssl_protocol_version(ssl), uVar4 < 0x304)) {
                uVar4 = DTLSRecordNumber::epoch((DTLSRecordNumber *)&record);
                bVar2 = uVar4 != 0;
              }
              else {
                uVar4 = DTLSRecordNumber::epoch((DTLSRecordNumber *)&record);
                bVar2 = true;
                if (uVar4 != 1) {
                  uVar4 = DTLSRecordNumber::epoch((DTLSRecordNumber *)&record);
                  bVar2 = 2 < uVar4;
                }
              }
              if (!bVar2) {
                ERR_put_error(0x10,0,0xe1,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/dtls_record.cc"
                              ,0x19e);
                *(undefined1 *)cbs.len = 10;
                return ssl_open_record_error;
              }
            }
            ssl->s3->warning_alert_count = '\0';
            *out_type = (uchar)record.body.len;
            out_number->combined_ = (uint64_t)record.read_epoch;
            return ssl_open_record_success;
          }
        }
        sVar6 = Span<unsigned_char>::size(&in);
        sVar10 = CBS_len((CBS *)local_50);
        *out_consumed = sVar6 - sVar10;
        ssl_local._4_4_ = ssl_open_record_discard;
      }
      else {
        sVar6 = Span<unsigned_char>::size(&in);
        *out_consumed = sVar6;
        ssl_local._4_4_ = ssl_open_record_discard;
      }
    }
  }
  return ssl_local._4_4_;
}

Assistant:

enum ssl_open_record_t dtls_open_record(SSL *ssl, uint8_t *out_type,
                                        DTLSRecordNumber *out_number,
                                        Span<uint8_t> *out,
                                        size_t *out_consumed,
                                        uint8_t *out_alert, Span<uint8_t> in) {
  *out_consumed = 0;
  if (ssl->s3->read_shutdown == ssl_shutdown_close_notify) {
    return ssl_open_record_close_notify;
  }

  if (in.empty()) {
    return ssl_open_record_partial;
  }

  CBS cbs(in);
  ParsedDTLSRecord record;
  if (!parse_dtls_record(ssl, &cbs, &record)) {
    // The record header was incomplete or malformed. Drop the entire packet.
    *out_consumed = in.size();
    return ssl_open_record_discard;
  }

  ssl_do_msg_callback(ssl, 0 /* read */, SSL3_RT_HEADER, record.header);

  if (record.read_epoch == nullptr ||
      record.read_epoch->bitmap.ShouldDiscard(record.number.sequence())) {
    // Drop this record. It's from an unknown epoch or is a replay. Note that if
    // the record is from next epoch, it could be buffered for later. For
    // simplicity, drop it and expect retransmit to handle it later; DTLS must
    // handle packet loss anyway.
    *out_consumed = in.size() - CBS_len(&cbs);
    return ssl_open_record_discard;
  }

  // Decrypt the body in-place.
  if (!record.read_epoch->aead->Open(out, record.type, record.version,
                                     dtls_aead_sequence(ssl, record.number),
                                     record.header,
                                     cbs_to_writable_bytes(record.body))) {
    // Bad packets are silently dropped in DTLS. See section 4.2.1 of RFC 6347.
    // Clear the error queue of any errors decryption may have added. Drop the
    // entire packet as it must not have come from the peer.
    //
    // TODO(davidben): This doesn't distinguish malloc failures from encryption
    // failures.
    ERR_clear_error();
    *out_consumed = in.size() - CBS_len(&cbs);
    return ssl_open_record_discard;
  }
  *out_consumed = in.size() - CBS_len(&cbs);

  // DTLS 1.3 hides the record type inside the encrypted data.
  bool has_padding = !record.read_epoch->aead->is_null_cipher() &&
                     ssl_protocol_version(ssl) >= TLS1_3_VERSION;
  // Check the plaintext length.
  size_t plaintext_limit = SSL3_RT_MAX_PLAIN_LENGTH + (has_padding ? 1 : 0);
  if (out->size() > plaintext_limit) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DATA_LENGTH_TOO_LONG);
    *out_alert = SSL_AD_RECORD_OVERFLOW;
    return ssl_open_record_error;
  }

  if (has_padding) {
    do {
      if (out->empty()) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_DECRYPTION_FAILED_OR_BAD_RECORD_MAC);
        *out_alert = SSL_AD_DECRYPT_ERROR;
        return ssl_open_record_error;
      }
      record.type = out->back();
      *out = out->subspan(0, out->size() - 1);
    } while (record.type == 0);
  }

  record.read_epoch->bitmap.Record(record.number.sequence());

  // Once we receive a record from the next epoch in DTLS 1.3, it becomes the
  // current epoch. Also save the previous epoch. This allows us to handle
  // packet reordering on KeyUpdate, as well as ACK retransmissions of the
  // Finished flight.
  if (record.read_epoch == ssl->d1->next_read_epoch.get()) {
    assert(ssl_protocol_version(ssl) >= TLS1_3_VERSION);
    auto prev = MakeUnique<DTLSPrevReadEpoch>();
    if (prev == nullptr) {
      *out_alert = SSL_AD_INTERNAL_ERROR;
      return ssl_open_record_error;
    }

    // Release the epoch after a timeout.
    prev->expire = ssl_ctx_get_current_time(ssl->ctx.get()).tv_sec;
    if (prev->expire >= UINT64_MAX - DTLS_PREV_READ_EPOCH_EXPIRE_SECONDS) {
      prev->expire = UINT64_MAX;  // Saturate on overflow.
    } else {
      prev->expire += DTLS_PREV_READ_EPOCH_EXPIRE_SECONDS;
    }

    prev->epoch = std::move(ssl->d1->read_epoch);
    ssl->d1->prev_read_epoch = std::move(prev);
    ssl->d1->read_epoch = std::move(*ssl->d1->next_read_epoch);
    ssl->d1->next_read_epoch = nullptr;
  }

  // TODO(davidben): Limit the number of empty records as in TLS? This is only
  // useful if we also limit discarded packets.

  if (record.type == SSL3_RT_ALERT) {
    return ssl_process_alert(ssl, out_alert, *out);
  }

  // Reject application data in epochs that do not allow it.
  if (record.type == SSL3_RT_APPLICATION_DATA) {
    bool app_data_allowed;
    if (ssl->s3->version != 0 && ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
      // Application data is allowed in 0-RTT (epoch 1) and after the handshake
      // (3 and up).
      app_data_allowed =
          record.number.epoch() == 1 || record.number.epoch() >= 3;
    } else {
      // Application data is allowed starting epoch 1.
      app_data_allowed = record.number.epoch() >= 1;
    }
    if (!app_data_allowed) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_RECORD);
      *out_alert = SSL_AD_UNEXPECTED_MESSAGE;
      return ssl_open_record_error;
    }
  }

  ssl->s3->warning_alert_count = 0;

  *out_type = record.type;
  *out_number = record.number;
  return ssl_open_record_success;
}